

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableKeyValueWalker::Get
          (RecyclableKeyValueWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  long lVar4;
  undefined4 *puVar5;
  IDiagObjectModelDisplay *pIVar6;
  RecyclableObject *this_00;
  char16_t *pcVar7;
  Type TVar8;
  
  if (i == 0) {
    lVar4 = 0x10;
    pcVar7 = L"key";
  }
  else {
    if (i != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xe72,"(false)","false");
      if (bVar2) {
        *puVar5 = 0;
        return 0;
      }
      goto LAB_007f03e1;
    }
    lVar4 = 0x18;
    pcVar7 = L"value";
  }
  pResolvedObject->name = pcVar7;
  aValue = *(Var *)((long)&(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase
                   + lVar4);
  pResolvedObject->obj = aValue;
  pResolvedObject->propId = -1;
  pResolvedObject->scriptContext = this->scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_007f03e1;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TVar8 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TVar8 = TypeIds_Number;
      goto LAB_007f02e2;
    }
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_007f03e1;
      *puVar5 = 0;
    }
    TVar8 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_007f03e1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_007f02e2:
  pResolvedObject->typeId = TVar8;
  pIVar6 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar6;
  (*pIVar6->_vptr_IDiagObjectModelDisplay[6])(pIVar6,0x820);
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  return 1;
}

Assistant:

BOOL RecyclableKeyValueWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i == 0)
        {
            pResolvedObject->name = _u("key");
            pResolvedObject->obj = key;
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("value");
            pResolvedObject->obj = value;
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = nullptr;

        return TRUE;
    }